

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::recalculateStamp(Calendar *this)

{
  int iVar1;
  int local_20;
  int local_1c;
  int32_t i;
  int32_t j;
  int32_t currentValue;
  int32_t index;
  Calendar *this_local;
  
  this->fNextStamp = 1;
  for (local_1c = 0; local_1c < 0x17; local_1c = local_1c + 1) {
    i = 10000;
    j = -1;
    for (local_20 = 0; local_20 < 0x17; local_20 = local_20 + 1) {
      if ((this->fNextStamp < this->fStamp[local_20]) && (this->fStamp[local_20] < i)) {
        i = this->fStamp[local_20];
        j = local_20;
      }
    }
    if (j < 0) break;
    iVar1 = this->fNextStamp + 1;
    this->fNextStamp = iVar1;
    this->fStamp[j] = iVar1;
  }
  this->fNextStamp = this->fNextStamp + 1;
  return;
}

Assistant:

void
Calendar::recalculateStamp() {
    int32_t index;
    int32_t currentValue;
    int32_t j, i;

    fNextStamp = 1;

    for (j = 0; j < UCAL_FIELD_COUNT; j++) {
        currentValue = STAMP_MAX;
        index = -1;
        for (i = 0; i < UCAL_FIELD_COUNT; i++) {
            if (fStamp[i] > fNextStamp && fStamp[i] < currentValue) {
                currentValue = fStamp[i];
                index = i;
            }
        }

        if (index >= 0) {
            fStamp[index] = ++fNextStamp;
        } else {
            break;
        }
    }
    fNextStamp++;
}